

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall Catch::TestSpecParser::preprocessPattern_abi_cxx11_(TestSpecParser *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  string *token;
  string *prefix;
  string local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  prefix = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 3));
  for (local_20 = 0; uVar1 = local_20,
      sVar3 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 4)),
      uVar1 < sVar3; local_20 = local_20 + 1) {
    clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 4),local_20);
    std::__cxx11::string::substr((ulong)local_60,(ulong)in_RDI);
    clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 4),local_20);
    std::__cxx11::string::substr((ulong)local_90,(ulong)in_RDI);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::operator=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_60);
  }
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x132a60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"exclude:",&local_b1);
  bVar2 = startsWith(in_RSI,prefix);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  if (bVar2) {
    *(undefined1 *)&in_RSI->_M_string_length = 1;
    std::__cxx11::string::substr((ulong)local_d8,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_d8);
    std::__cxx11::string::~string(local_d8);
  }
  std::__cxx11::string::clear();
  *(undefined8 *)((long)&in_RSI->field_2 + 8) = 0;
  return prefix;
}

Assistant:

std::string TestSpecParser::preprocessPattern() {
        std::string token = m_patternName;
        for (std::size_t i = 0; i < m_escapeChars.size(); ++i)
            token = token.substr(0, m_escapeChars[i] - i) + token.substr(m_escapeChars[i] - i + 1);
        m_escapeChars.clear();
        if (startsWith(token, "exclude:")) {
            m_exclusion = true;
            token = token.substr(8);
        }

        m_patternName.clear();
        m_realPatternPos = 0;

        return token;
    }